

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

vm_obj_id_t CVmObjFrameDesc::create(vm_obj_id_t fref,int frame_idx,uint ret_ofs)

{
  vm_obj_id_t obj_id;
  CVmObjFrameDesc *this;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,1,0);
  this = (CVmObjFrameDesc *)CVmObject::operator_new(0x10,obj_id);
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00329ed0;
  (this->super_CVmObject).ext_ = (char *)0x0;
  alloc_ext(this,fref,frame_idx,ret_ofs);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjFrameDesc::create(
    VMG_ vm_obj_id_t fref, int frame_idx, uint ret_ofs)
{
    /* allocate an object ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* instantiate the new object */
    new (vmg_ id) CVmObjFrameDesc(vmg_ fref, frame_idx, ret_ofs);

    /* return the new object's ID */
    return id;
}